

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManReverseLevel(Gia_Man_t *p)

{
  int iVar1;
  uint Lit;
  int iVar2;
  uint uVar3;
  int Value;
  int iVar4;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int iVar5;
  long lVar6;
  
  p_00 = Vec_IntStart(p->nObjs);
  iVar1 = p->nObjs;
  uVar3 = iVar1 - 1;
  lVar6 = 0;
  while( true ) {
    iVar2 = (int)lVar6;
    if (iVar1 + iVar2 < 2) {
      return p_00;
    }
    iVar5 = uVar3 + iVar2;
    pObj = Gia_ManObj(p,iVar5);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      Value = Vec_IntEntry(p_00,iVar5);
      iVar4 = Gia_ObjIsMux(p,pObj);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsXor(pObj);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsBuf(pObj);
          iVar5 = iVar5 - (*(uint *)pObj & 0x1fffffff);
          if (iVar4 == 0) {
            Value = Value + 1;
            Vec_IntUpdateEntry(p_00,iVar5,Value);
            iVar5 = (uVar3 + iVar2) - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
          }
        }
        else {
          Value = Value + 2;
          Vec_IntUpdateEntry(p_00,(uVar3 + iVar2) - (*(uint *)pObj & 0x1fffffff),Value);
          iVar5 = (uVar3 + iVar2) - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
        }
      }
      else {
        Value = Value + 2;
        Vec_IntUpdateEntry(p_00,(uVar3 + iVar2) - (*(uint *)pObj & 0x1fffffff),Value);
        Vec_IntUpdateEntry(p_00,(uVar3 + iVar2) - (*(uint *)&pObj->field_0x4 & 0x1fffffff),Value);
        iVar5 = -1;
        if ((p->pMuxes != (uint *)0x0) && (Lit = p->pMuxes[(ulong)uVar3 + lVar6], Lit != 0)) {
          iVar5 = Abc_Lit2Var(Lit);
        }
      }
      Vec_IntUpdateEntry(p_00,iVar5,Value);
    }
    lVar6 = lVar6 + -1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManReverseLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vLevelRev;
    Gia_Obj_t * pObj;
    int i;
    vLevelRev = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndReverse( p, pObj, i )
    {
        int LevelR = Vec_IntEntry( vLevelRev, i );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId2(p, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsXor(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsBuf(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR );
        }
        else
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 1 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 1 );
        }
    }
    return vLevelRev;
}